

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketServer.cpp
# Opt level: O0

socket_handle __thiscall
FIX::SocketServer::add
          (SocketServer *this,int port,bool reuse,bool noDelay,int sendBufSize,int rcvBufSize)

{
  bool bVar1;
  SocketException *this_00;
  mapped_type *pmVar2;
  undefined1 local_5c [8];
  SocketInfo info;
  socket_handle local_3c;
  iterator iStack_38;
  socket_handle socket;
  _Self local_30;
  int local_28;
  int local_24;
  int rcvBufSize_local;
  int sendBufSize_local;
  bool noDelay_local;
  bool reuse_local;
  SocketServer *pSStack_18;
  int port_local;
  SocketServer *this_local;
  
  local_28 = rcvBufSize;
  local_24 = sendBufSize;
  rcvBufSize_local._2_1_ = noDelay;
  rcvBufSize_local._3_1_ = reuse;
  sendBufSize_local = port;
  pSStack_18 = this;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<int,_FIX::SocketInfo,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketInfo>_>_>
       ::find(&this->m_portToInfo,&sendBufSize_local);
  iStack_38 = std::
              map<int,_FIX::SocketInfo,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketInfo>_>_>
              ::end(&this->m_portToInfo);
  bVar1 = std::operator!=(&local_30,&stack0xffffffffffffffc8);
  if (bVar1) {
    pmVar2 = std::
             map<int,_FIX::SocketInfo,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketInfo>_>_>
             ::operator[](&this->m_portToInfo,&sendBufSize_local);
    this_local._4_4_ = pmVar2->m_socket;
  }
  else {
    local_3c = socket_createAcceptor(sendBufSize_local,(bool)(rcvBufSize_local._3_1_ & 1));
    if (local_3c == -1) {
      this_00 = (SocketException *)__cxa_allocate_exception(0x50);
      SocketException::SocketException(this_00);
      __cxa_throw(this_00,&SocketException::typeinfo,SocketException::~SocketException);
    }
    if ((rcvBufSize_local._2_1_ & 1) != 0) {
      socket_setsockopt(local_3c,1);
    }
    if (local_24 != 0) {
      socket_setsockopt(local_3c,7,local_24);
    }
    if (local_28 != 0) {
      socket_setsockopt(local_3c,8,local_28);
    }
    SocketMonitor::addRead(&this->m_monitor,local_3c);
    SocketInfo::SocketInfo
              ((SocketInfo *)local_5c,local_3c,(short)sendBufSize_local,
               (bool)(rcvBufSize_local._2_1_ & 1),local_24,local_28);
    pmVar2 = std::
             map<int,_FIX::SocketInfo,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketInfo>_>_>
             ::operator[](&this->m_socketToInfo,&local_3c);
    pmVar2->m_socket = local_5c._0_4_;
    pmVar2->m_port = local_5c._4_2_;
    pmVar2->m_noDelay = (bool)local_5c[6];
    pmVar2->field_0x7 = local_5c[7];
    *(undefined8 *)&pmVar2->m_sendBufSize = info._0_8_;
    pmVar2 = std::
             map<int,_FIX::SocketInfo,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketInfo>_>_>
             ::operator[](&this->m_portToInfo,&sendBufSize_local);
    pmVar2->m_socket = local_5c._0_4_;
    pmVar2->m_port = local_5c._4_2_;
    pmVar2->m_noDelay = (bool)local_5c[6];
    pmVar2->field_0x7 = local_5c[7];
    *(undefined8 *)&pmVar2->m_sendBufSize = info._0_8_;
    this_local._4_4_ = local_3c;
  }
  return this_local._4_4_;
}

Assistant:

socket_handle SocketServer::add( int port, bool reuse, bool noDelay,
                       int sendBufSize, int rcvBufSize )
  EXCEPT ( SocketException& )
{
  if( m_portToInfo.find(port) != m_portToInfo.end() )
    return m_portToInfo[port].m_socket;

  socket_handle socket = socket_createAcceptor( port, reuse );
  if( socket == INVALID_SOCKET_HANDLE)
    throw SocketException();
  if( noDelay )
    socket_setsockopt( socket, TCP_NODELAY );
  if( sendBufSize )
    socket_setsockopt( socket, SO_SNDBUF, sendBufSize );
  if( rcvBufSize )
    socket_setsockopt( socket, SO_RCVBUF, rcvBufSize );
  m_monitor.addRead( socket );

  SocketInfo info( socket, port, noDelay, sendBufSize, rcvBufSize );
  m_socketToInfo[socket] = info;
  m_portToInfo[port] = info;
  return socket;
}